

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O3

void av1_upscale_normative_rows
               (AV1_COMMON *cm,uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int plane,
               int rows)

{
  uint8_t *puVar1;
  byte bVar2;
  ushort uVar3;
  aom_bit_depth_t aVar4;
  size_t size;
  size_t size_00;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int *piVar9;
  void *memblk;
  void *memblk_00;
  undefined8 *puVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint8_t *puVar20;
  int iVar21;
  int iVar22;
  int *piVar23;
  undefined8 *puVar24;
  int *piVar25;
  undefined8 *puVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  TileInfo tile_col;
  
  if (plane < 1) {
    bVar27 = false;
  }
  else {
    bVar27 = cm->seq_params->subsampling_x != 0;
  }
  uVar17 = (uint)(1 << bVar27) >> 1;
  iVar15 = (int)(cm->width + uVar17) >> bVar27;
  iVar18 = uVar17 + cm->superres_upscaled_width;
  iVar22 = iVar18 >> bVar27;
  iVar19 = iVar22 - (iVar18 >> 0x1f) >> 1;
  iVar18 = (iVar19 + iVar15 * 0x4000) / iVar22;
  if (0 < (cm->tiles).cols) {
    bVar2 = cm->superres_scale_denominator;
    iVar8 = iVar18 * iVar22 + iVar15 * -0x4000;
    uVar17 = (((iVar15 - iVar22) * 0x2000 + iVar19) / iVar22 -
             ((uint)(iVar8 - (iVar8 >> 0x1f)) >> 1)) + 0x80 & 0x3fff;
    size_00 = (long)rows * 10;
    lVar14 = (long)src_stride;
    size = (long)rows * 5;
    lVar5 = (ulong)(uint)rows * 10;
    lVar6 = lVar14 * 2;
    lVar7 = (ulong)(uint)rows * 5;
    iVar15 = 0;
    do {
      av1_tile_set_col(&tile_col,cm,iVar15);
      iVar8 = tile_col.mi_col_start << (2U - bVar27 & 0x1f);
      iVar16 = tile_col.mi_col_end << (2U - bVar27 & 0x1f);
      iVar12 = iVar8 * (uint)bVar2;
      iVar19 = iVar12 + 7;
      if (-1 < iVar12) {
        iVar19 = iVar12;
      }
      iVar21 = (cm->tiles).cols + -1;
      iVar12 = iVar22;
      if (iVar15 != iVar21) {
        iVar13 = iVar16 * (uint)bVar2;
        iVar12 = iVar13 + 7;
        if (-1 < iVar13) {
          iVar12 = iVar13;
        }
        iVar12 = iVar12 >> 3;
      }
      iVar16 = iVar16 - iVar8;
      puVar20 = src + iVar8;
      puVar1 = dst + (iVar19 >> 3);
      iVar12 = iVar12 - (iVar19 >> 3);
      if (cm->seq_params->use_highbitdepth == '\0') {
        piVar23 = (int *)(puVar20 + -5);
        if (iVar15 == 0) {
          memblk = aom_malloc(size);
          if (memblk == (void *)0x0) goto LAB_009b870a;
          if (0 < rows) {
            lVar11 = 0;
            piVar25 = piVar23;
            do {
              *(char *)((long)memblk + lVar11 + 4) = (char)piVar25[1];
              *(int *)((long)memblk + lVar11) = *piVar25;
              iVar19 = (uint)*(byte *)((long)piVar25 + 5) * 0x1010101;
              *piVar25 = iVar19;
              *(char *)(piVar25 + 1) = (char)iVar19;
              lVar11 = lVar11 + 5;
              piVar25 = (int *)((long)piVar25 + lVar14);
            } while (lVar7 != lVar11);
          }
        }
        else {
          memblk = (void *)0x0;
        }
        piVar25 = (int *)(puVar20 + iVar16);
        if (iVar15 == iVar21) {
          memblk_00 = aom_malloc(size);
          if (memblk_00 != (void *)0x0) {
            if (0 < rows) {
              lVar11 = 0;
              piVar9 = piVar25;
              do {
                *(char *)((long)memblk_00 + lVar11 + 4) = (char)piVar9[1];
                *(int *)((long)memblk_00 + lVar11) = *piVar9;
                iVar19 = (uint)*(byte *)((long)piVar9 + -1) * 0x1010101;
                *piVar9 = iVar19;
                *(char *)(piVar9 + 1) = (char)iVar19;
                lVar11 = lVar11 + 5;
                piVar9 = (int *)((long)piVar9 + lVar14);
              } while (lVar7 != lVar11);
              goto LAB_009b8518;
            }
            (*av1_convolve_horiz_rs)
                      (puVar20 + -1,src_stride,puVar1,dst_stride,iVar12,rows,
                       av1_resize_filter_normative[0],uVar17,iVar18);
            if (iVar15 == 0) goto LAB_009b861c;
            goto LAB_009b87e4;
          }
LAB_009b8702:
          aom_free(memblk);
          goto LAB_009b870a;
        }
        memblk_00 = (void *)0x0;
LAB_009b8518:
        (*av1_convolve_horiz_rs)
                  (puVar20 + -1,src_stride,puVar1,dst_stride,iVar12,rows,
                   av1_resize_filter_normative[0],uVar17,iVar18);
        if (iVar15 == 0) {
          if (0 < rows) {
            lVar11 = 0;
            do {
              *(undefined1 *)(piVar23 + 1) = *(undefined1 *)((long)memblk + lVar11 + 4);
              *piVar23 = *(int *)((long)memblk + lVar11);
              lVar11 = lVar11 + 5;
              piVar23 = (int *)((long)piVar23 + lVar14);
            } while (lVar7 != lVar11);
          }
LAB_009b861c:
          aom_free(memblk);
        }
        if (iVar15 == iVar21) {
          if (0 < rows) {
            lVar11 = 0;
            do {
              *(undefined1 *)(piVar25 + 1) = *(undefined1 *)((long)memblk_00 + lVar11 + 4);
              *piVar25 = *(int *)((long)memblk_00 + lVar11);
              lVar11 = lVar11 + 5;
              piVar25 = (int *)((long)piVar25 + lVar14);
            } while (lVar7 != lVar11);
          }
          goto LAB_009b87e4;
        }
      }
      else {
        aVar4 = cm->seq_params->bit_depth;
        puVar24 = (undefined8 *)((long)puVar20 * 2 + -10);
        if (iVar15 == 0) {
          memblk = aom_malloc(size_00);
          if (memblk != (void *)0x0) {
            if (0 < rows) {
              lVar11 = 0;
              puVar26 = puVar24;
              do {
                *(undefined2 *)((long)memblk + lVar11 + 8) = *(undefined2 *)(puVar26 + 1);
                *(undefined8 *)((long)memblk + lVar11) = *puVar26;
                uVar3 = *(ushort *)((long)puVar26 + 10);
                auVar28 = pshuflw(ZEXT216(uVar3),ZEXT216(uVar3),0);
                *puVar26 = auVar28._0_8_;
                *(ushort *)(puVar26 + 1) = uVar3;
                lVar11 = lVar11 + 10;
                puVar26 = (undefined8 *)((long)puVar26 + lVar6);
              } while (lVar5 != lVar11);
            }
            goto LAB_009b867a;
          }
LAB_009b870a:
          aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Error upscaling frame");
        }
        else {
          memblk = (void *)0x0;
LAB_009b867a:
          puVar26 = (undefined8 *)((long)iVar16 * 2 + (long)puVar20 * 2);
          if (iVar15 == iVar21) {
            memblk_00 = aom_malloc(size_00);
            if (memblk_00 == (void *)0x0) goto LAB_009b8702;
            if (0 < rows) {
              lVar11 = 0;
              puVar10 = puVar26;
              do {
                *(undefined2 *)((long)memblk_00 + lVar11 + 8) = *(undefined2 *)(puVar10 + 1);
                *(undefined8 *)((long)memblk_00 + lVar11) = *puVar10;
                uVar3 = *(ushort *)((long)puVar10 + -2);
                auVar28 = pshuflw(ZEXT216(uVar3),ZEXT216(uVar3),0);
                *puVar10 = auVar28._0_8_;
                *(ushort *)(puVar10 + 1) = uVar3;
                lVar11 = lVar11 + 10;
                puVar10 = (undefined8 *)((long)puVar10 + lVar6);
              } while (lVar5 != lVar11);
            }
          }
          else {
            memblk_00 = (void *)0x0;
          }
          (*av1_highbd_convolve_horiz_rs)
                    ((uint16_t *)((long)puVar20 * 2 + -2),src_stride,(uint16_t *)((long)puVar1 * 2),
                     dst_stride,iVar12,rows,av1_resize_filter_normative[0],uVar17,iVar18,aVar4);
          if (iVar15 == 0) {
            if (0 < rows) {
              lVar11 = 0;
              do {
                *(undefined2 *)(puVar24 + 1) = *(undefined2 *)((long)memblk + lVar11 + 8);
                *puVar24 = *(undefined8 *)((long)memblk + lVar11);
                lVar11 = lVar11 + 10;
                puVar24 = (undefined8 *)((long)puVar24 + lVar6);
              } while (lVar5 != lVar11);
            }
            aom_free(memblk);
          }
          if (iVar15 == iVar21) {
            if (0 < rows) {
              lVar11 = 0;
              do {
                *(undefined2 *)(puVar26 + 1) = *(undefined2 *)((long)memblk_00 + lVar11 + 8);
                *puVar26 = *(undefined8 *)((long)memblk_00 + lVar11);
                lVar11 = lVar11 + 10;
                puVar26 = (undefined8 *)((long)puVar26 + lVar6);
              } while (lVar5 != lVar11);
            }
LAB_009b87e4:
            aom_free(memblk_00);
          }
        }
      }
      uVar17 = uVar17 + iVar16 * -0x4000 + iVar12 * iVar18;
      iVar15 = iVar15 + 1;
    } while (iVar15 < (cm->tiles).cols);
  }
  return;
}

Assistant:

void av1_upscale_normative_rows(const AV1_COMMON *cm, const uint8_t *src,
                                int src_stride, uint8_t *dst, int dst_stride,
                                int plane, int rows) {
  const int is_uv = (plane > 0);
  const int ss_x = is_uv && cm->seq_params->subsampling_x;
  const int downscaled_plane_width = ROUND_POWER_OF_TWO(cm->width, ss_x);
  const int upscaled_plane_width =
      ROUND_POWER_OF_TWO(cm->superres_upscaled_width, ss_x);
  const int superres_denom = cm->superres_scale_denominator;

  TileInfo tile_col;
  const int32_t x_step_qn = av1_get_upscale_convolve_step(
      downscaled_plane_width, upscaled_plane_width);
  int32_t x0_qn = get_upscale_convolve_x0(downscaled_plane_width,
                                          upscaled_plane_width, x_step_qn);

  for (int j = 0; j < cm->tiles.cols; j++) {
    av1_tile_set_col(&tile_col, cm, j);
    // Determine the limits of this tile column in both the source
    // and destination images.
    // Note: The actual location which we start sampling from is
    // (downscaled_x0 - 1 + (x0_qn/2^14)), and this quantity increases
    // by exactly dst_width * (x_step_qn/2^14) pixels each iteration.
    const int downscaled_x0 = tile_col.mi_col_start << (MI_SIZE_LOG2 - ss_x);
    const int downscaled_x1 = tile_col.mi_col_end << (MI_SIZE_LOG2 - ss_x);
    const int src_width = downscaled_x1 - downscaled_x0;

    const int upscaled_x0 = (downscaled_x0 * superres_denom) / SCALE_NUMERATOR;
    int upscaled_x1;
    if (j == cm->tiles.cols - 1) {
      // Note that we can't just use AOMMIN here - due to rounding,
      // (downscaled_x1 * superres_denom) / SCALE_NUMERATOR may be less than
      // upscaled_plane_width.
      upscaled_x1 = upscaled_plane_width;
    } else {
      upscaled_x1 = (downscaled_x1 * superres_denom) / SCALE_NUMERATOR;
    }

    const uint8_t *const src_ptr = src + downscaled_x0;
    uint8_t *const dst_ptr = dst + upscaled_x0;
    const int dst_width = upscaled_x1 - upscaled_x0;

    const int pad_left = (j == 0);
    const int pad_right = (j == cm->tiles.cols - 1);

    bool success;
#if CONFIG_AV1_HIGHBITDEPTH
    if (cm->seq_params->use_highbitdepth)
      success = highbd_upscale_normative_rect(
          src_ptr, rows, src_width, src_stride, dst_ptr, rows, dst_width,
          dst_stride, x_step_qn, x0_qn, pad_left, pad_right,
          cm->seq_params->bit_depth);
    else
      success = upscale_normative_rect(src_ptr, rows, src_width, src_stride,
                                       dst_ptr, rows, dst_width, dst_stride,
                                       x_step_qn, x0_qn, pad_left, pad_right);
#else
    success = upscale_normative_rect(src_ptr, rows, src_width, src_stride,
                                     dst_ptr, rows, dst_width, dst_stride,
                                     x_step_qn, x0_qn, pad_left, pad_right);
#endif
    if (!success) {
      aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                         "Error upscaling frame");
    }
    // Update the fractional pixel offset to prepare for the next tile column.
    x0_qn += (dst_width * x_step_qn) - (src_width << RS_SCALE_SUBPEL_BITS);
  }
}